

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O1

void __thiscall diligent_spirv_cross::CFG::add_branch(CFG *this,uint32_t from,uint32_t to)

{
  size_t sVar1;
  uint uVar2;
  mapped_type *pmVar3;
  uint *puVar4;
  uint local_18;
  uint local_14;
  
  local_18 = from;
  local_14 = to;
  pmVar3 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->preceding_edges,&local_14);
  uVar2 = local_18;
  puVar4 = (pmVar3->super_VectorView<unsigned_int>).ptr;
  puVar4 = ::std::__find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                     (puVar4,puVar4 + (pmVar3->super_VectorView<unsigned_int>).buffer_size);
  sVar1 = (pmVar3->super_VectorView<unsigned_int>).buffer_size;
  if (puVar4 == (pmVar3->super_VectorView<unsigned_int>).ptr + sVar1) {
    SmallVector<unsigned_int,_8UL>::reserve(pmVar3,sVar1 + 1);
    sVar1 = (pmVar3->super_VectorView<unsigned_int>).buffer_size;
    (pmVar3->super_VectorView<unsigned_int>).ptr[sVar1] = uVar2;
    (pmVar3->super_VectorView<unsigned_int>).buffer_size = sVar1 + 1;
  }
  pmVar3 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->succeeding_edges,&local_18);
  uVar2 = local_14;
  puVar4 = (pmVar3->super_VectorView<unsigned_int>).ptr;
  puVar4 = ::std::__find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                     (puVar4,puVar4 + (pmVar3->super_VectorView<unsigned_int>).buffer_size);
  sVar1 = (pmVar3->super_VectorView<unsigned_int>).buffer_size;
  if (puVar4 == (pmVar3->super_VectorView<unsigned_int>).ptr + sVar1) {
    SmallVector<unsigned_int,_8UL>::reserve(pmVar3,sVar1 + 1);
    sVar1 = (pmVar3->super_VectorView<unsigned_int>).buffer_size;
    (pmVar3->super_VectorView<unsigned_int>).ptr[sVar1] = uVar2;
    (pmVar3->super_VectorView<unsigned_int>).buffer_size = sVar1 + 1;
  }
  return;
}

Assistant:

void CFG::add_branch(uint32_t from, uint32_t to)
{
	const auto add_unique = [](SmallVector<uint32_t> &l, uint32_t value) {
		auto itr = find(begin(l), end(l), value);
		if (itr == end(l))
			l.push_back(value);
	};
	add_unique(preceding_edges[to], from);
	add_unique(succeeding_edges[from], to);
}